

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall
helics::FederateInfo::loadInfoFromToml(FederateInfo *this,string *tomlString,bool runArgParser)

{
  bool bVar1;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *optionConversion;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *valueConversion;
  const_pointer __s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer this_01;
  element_type *this_02;
  size_type sVar2;
  byte in_DL;
  _Base_ptr in_RSI;
  Error *e;
  ifstream file;
  istringstream tstring;
  shared_ptr<helics::HelicsConfigJSON> dptr;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  value_type *prop;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  timeCall;
  invalid_argument *iarg;
  value doc;
  FederateInfo *in_stack_00001908;
  App *in_stack_fffffffffffff928;
  basic_value<toml::type_config> *in_stack_fffffffffffff930;
  App *this_03;
  anon_class_1_0_00000001 *in_stack_fffffffffffff938;
  anon_class_1_0_00000001 *__f;
  basic_value<toml::type_config> *in_stack_fffffffffffff940;
  function<void_(int,_int)> *this_04;
  basic_value<toml::type_config> *in_stack_fffffffffffff948;
  function<void_(int,_int)> *in_stack_fffffffffffff958;
  char __c;
  value *in_stack_fffffffffffff970;
  undefined1 local_668 [352];
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_fffffffffffffaf8;
  string *in_stack_fffffffffffffb00;
  value *in_stack_fffffffffffffb08;
  istringstream local_460 [72];
  string *in_stack_fffffffffffffbe8;
  __shared_ptr local_2d0 [32];
  function<void_(int,_int)> local_2b0;
  anon_class_1_0_00000001 local_288 [40];
  undefined1 local_260 [39];
  function<void_(int,_int)> local_239;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_218;
  _Any_data local_210;
  undefined1 *local_200;
  byte local_11;
  _Base_ptr local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  toml::basic_value<toml::type_config>::basic_value(in_stack_fffffffffffff930);
  fileops::loadToml(in_stack_fffffffffffffbe8);
  toml::basic_value<toml::type_config>::operator=
            (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffff930);
  std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>::
  function<helics::FederateInfo::loadInfoFromToml(std::__cxx11::string_const&,bool)::__0,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
              *)in_stack_fffffffffffff940,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff938);
  local_200 = propStringsTranslations;
  optionConversion =
       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)frozen::
          unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::begin((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)0x401dc9);
  local_210._8_8_ = optionConversion;
  valueConversion =
       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)frozen::
          unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)0x401de9);
  local_210._M_unused._M_object = valueConversion;
  for (; (void *)local_210._8_8_ != local_210._M_unused._M_object;
      local_210._8_8_ = local_210._8_8_ + 0x18) {
    local_218 = (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)local_210._8_8_;
    if (*(int *)(local_210._8_8_ + 0x10) < 0xc9) {
      __s = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_210._8_8_);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_218);
      in_stack_fffffffffffff958 = (function<void_(int,_int)> *)(local_260 + 0x27);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (this_00,__s,(size_type)in_stack_fffffffffffff940,
                 (allocator<char> *)in_stack_fffffffffffff938);
      fileops::callIfMember
                (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff930);
      std::allocator<char>::~allocator((allocator<char> *)(local_260 + 0x27));
    }
  }
  this_03 = (App *)local_260;
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::FederateInfo::loadInfoFromToml(std::__cxx11::string_const&,bool)::__1,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  __f = local_288;
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::FederateInfo::loadInfoFromToml(std::__cxx11::string_const&,bool)::__2,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffff940,__f);
  this_04 = &local_2b0;
  std::function<void(int,int)>::
  function<helics::FederateInfo::loadInfoFromToml(std::__cxx11::string_const&,bool)::__3,void>
            (this_04,(anon_class_8_1_8991fb9c *)__f);
  processOptions(in_stack_fffffffffffff970,optionConversion,valueConversion,
                 in_stack_fffffffffffff958);
  __c = (char)((ulong)optionConversion >> 0x38);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x401fc7);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x401fd4);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x401fe1);
  if ((local_11 & 1) != 0) {
    makeCLIApp(in_stack_00001908);
    this_01 = CLI::std::
              unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
              operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                          *)0x402010);
    CLI::App::allow_extras(&this_01->super_App,true);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x40202c);
    CLI::App::get_config_formatter_base(in_stack_fffffffffffff928);
    std::static_pointer_cast<helics::HelicsConfigJSON,CLI::ConfigBase>
              ((shared_ptr<CLI::ConfigBase> *)__f);
    CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x402060);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_2d0);
    if (bVar1) {
      this_02 = CLI::std::
                __shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x402083);
      HelicsConfigJSON::skipJson(this_02,true);
    }
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff970,__c,(size_type)valueConversion);
    if (sVar2 == 0xffffffffffffffff) {
      std::ifstream::ifstream(local_668,(string *)local_10,_S_in);
      CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
      operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *
                 )0x4021d5);
      CLI::App::parse_from_stream(this_03,(istream *)in_stack_fffffffffffff928);
      std::ifstream::~ifstream(local_668);
    }
    else {
      std::__cxx11::istringstream::istringstream(local_460,(string *)local_10,_S_in);
      CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
      operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *
                 )0x40214f);
      CLI::App::parse_from_stream(this_03,(istream *)in_stack_fffffffffffff928);
      std::__cxx11::istringstream::~istringstream(local_460);
    }
    CLI::std::shared_ptr<helics::HelicsConfigJSON>::~shared_ptr
              ((shared_ptr<helics::HelicsConfigJSON> *)0x4022bb);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
                this_04);
  }
  CLI::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
               *)0x4022f3);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)this_03);
  return;
}

Assistant:

void FederateInfo::loadInfoFromToml(const std::string& tomlString, bool runArgParser)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }

    const std::function<void(const std::string&, Time)> timeCall = [this](const std::string& fname,
                                                                          Time arg) {
        setProperty(propStringsTranslations.at(fname), arg);
    };

    for (const auto& prop : propStringsTranslations) {
        if (prop.second > 200) {
            continue;
        }
        fileops::callIfMember(doc, std::string(prop.first.data(), prop.first.size()), timeCall);
    }

    processOptions(
        doc,
        [](const std::string& option) { return getFlagIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [this](int32_t option, int32_t value) { setFlagOption(option, value != 0); });

    if (runArgParser) {
        auto app = makeCLIApp();
        app->allow_extras();
        auto dptr = std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
        if (dptr) {
            dptr->skipJson(true);
        }
        try {
            if (tomlString.find('=') != std::string::npos) {
                std::istringstream tstring(tomlString);
                app->parse_from_stream(tstring);
            } else {
                std::ifstream file(tomlString);
                app->parse_from_stream(file);
            }
        }
        catch (const CLI::Error& e) {
            throw(InvalidIdentifier(e.what()));
        }
    }
}